

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnumeric.cpp
# Opt level: O3

quint64 qFloatDistance(double a,double b)

{
  bool bVar1;
  bool bVar2;
  quint64 qVar3;
  double dVar4;
  long lVar5;
  double dVar6;
  double b_00;
  double dVar7;
  
  if ((a != b) || (NAN(a) || NAN(b))) {
    dVar4 = 0.0;
    lVar5 = 0;
    do {
      dVar7 = -b;
      dVar6 = -a;
      b_00 = dVar6;
      if (dVar6 <= a) {
        b_00 = a;
      }
      if (a < dVar6 != dVar7 <= b) {
        dVar6 = (double)(~-(ulong)(a < 0.0) & (ulong)b | (ulong)dVar7 & -(ulong)(a < 0.0));
        if (((a != 0.0) || (dVar4 = dVar6, NAN(a))) && ((b != 0.0 || (dVar4 = b_00, NAN(b))))) {
          dVar4 = b_00;
          if (dVar6 < b_00) {
            dVar4 = dVar6;
            dVar6 = b_00;
          }
          dVar4 = (double)((long)dVar6 - (long)dVar4);
        }
        break;
      }
      dVar6 = (double)(~-(ulong)(a < 0.0) & (ulong)dVar7 | -(ulong)(a < 0.0) & (ulong)b);
      qVar3 = qFloatDistance(0.0,b_00);
      lVar5 = lVar5 + qVar3;
      bVar1 = NAN(b);
      bVar2 = b != 0.0;
      a = 0.0;
      b = dVar6;
    } while ((bVar2) || (bVar1));
  }
  else {
    lVar5 = 0;
    dVar4 = 0.0;
  }
  return lVar5 + (long)dVar4;
}

Assistant:

Q_CORE_EXPORT quint64 qFloatDistance(double a, double b)
{
    static const quint64 smallestPositiveFloatAsBits = 0x1;  // denormalized, (SMALLEST)
    /* Assumes:
       * IEE754 format double precision
       * Integers and floats have the same endian
    */
    static_assert(sizeof(quint64) == sizeof(double));
    Q_ASSERT(qIsFinite(a) && qIsFinite(b));
    if (a == b)
        return 0;
    if ((a < 0) != (b < 0)) {
        // if they have different signs
        if (a < 0)
            a = -a;
        else /*if (b < 0)*/
            b = -b;
        return qFloatDistance(0.0, a) + qFloatDistance(0.0, b);
    }
    if (a < 0) {
        a = -a;
        b = -b;
    }
    // at this point a and b should not be negative

    // 0 is special
    if (!a)
        return d2i(b) - smallestPositiveFloatAsBits + 1;
    if (!b)
        return d2i(a) - smallestPositiveFloatAsBits + 1;

    // finally do the common integer subtraction
    return a > b ? d2i(a) - d2i(b) : d2i(b) - d2i(a);
}